

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O1

void Sle_ManMarkupVariables(Sle_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  int *piVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  long lVar8;
  
  pGVar3 = p->pGia;
  iVar5 = pGVar3->nObjs;
  p->nNodeVars = iVar5;
  if (0 < iVar5) {
    pGVar6 = pGVar3->pObjs;
    lVar7 = 0;
    do {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        if (p->vCutFirst->nSize <= lVar7) goto LAB_007a0229;
        p->vCutFirst->pArray[lVar7] = iVar5;
        iVar1 = p->vCuts->nSize;
        if (iVar1 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = p->vCuts->pArray;
        iVar2 = piVar4[lVar7];
        if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar5 = iVar5 + piVar4[iVar2];
      }
      lVar7 = lVar7 + 1;
      pGVar6 = pGVar6 + 1;
    } while (lVar7 < pGVar3->nObjs);
  }
  p->nCutVars = iVar5 - p->nNodeVars;
  if (0 < pGVar3->nObjs) {
    pGVar6 = pGVar3->pObjs;
    lVar7 = 4;
    lVar8 = 0;
    do {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        if (p->vEdgeFirst->nSize <= lVar8) goto LAB_007a0229;
        p->vEdgeFirst->pArray[lVar8] = iVar5;
        if (p->vCutFanins->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        iVar5 = iVar5 + *(int *)((long)&p->vCutFanins->pArray->nCap + lVar7);
      }
      lVar8 = lVar8 + 1;
      pGVar6 = pGVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < pGVar3->nObjs);
  }
  p->nEdgeVars = iVar5 - (p->nCutVars + p->nNodeVars);
  if (0 < pGVar3->nObjs) {
    pGVar6 = pGVar3->pObjs;
    lVar7 = 0;
    do {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        if (p->vDelayFirst->nSize <= lVar7) {
LAB_007a0229:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vDelayFirst->pArray[lVar7] = iVar5;
        iVar5 = iVar5 + p->nLevels;
      }
      lVar7 = lVar7 + 1;
      pGVar6 = pGVar6 + 1;
    } while (lVar7 < pGVar3->nObjs);
  }
  p->nDelayVars = iVar5 - (p->nEdgeVars + p->nCutVars + p->nNodeVars);
  p->nVarsTotal = iVar5;
  return;
}

Assistant:

void Sle_ManMarkupVariables( Sle_Man_t * p )
{
    int iObj, Counter = Gia_ManObjNum(p->pGia);
    // node variables
    p->nNodeVars = Counter;
    // cut variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vCutFirst, iObj, Counter );
        Counter += Sle_ListCutNum( Sle_ManList(p, iObj) );
    }
    p->nCutVars = Counter - p->nNodeVars;
    // edge variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vEdgeFirst, iObj, Counter );
        Counter += Vec_IntSize( Vec_WecEntry(p->vCutFanins, iObj) );
    }
    p->nEdgeVars = Counter - p->nCutVars - p->nNodeVars;
    // delay variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vDelayFirst, iObj, Counter );
        Counter += p->nLevels;
    }
    p->nDelayVars = Counter - p->nEdgeVars - p->nCutVars - p->nNodeVars;
    p->nVarsTotal = Counter;
}